

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O0

SUNErrCode
SUNDataNode_CreateObject_InMem
          (sundataindex init_size,SUNContext_conflict sunctx,SUNDataNode *node_out)

{
  SUNDataNode map_00;
  undefined8 *in_RDX;
  SUNContext_conflict in_RSI;
  SUNHashMap map;
  SUNDataNode node;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_30;
  
  map_00 = sunDataNode_CreateCommon_InMem(in_RSI);
  map_00->dtype = SUNDATANODE_OBJECT;
  SUNHashMap_New((int64_t)in_RDX,(_func_SUNErrCode_SUNHashMapKeyValue_ptr *)in_RSI,
                 (SUNHashMap *)map_00);
  *(undefined8 *)((long)map_00->content + 0x20) = local_30;
  *in_RDX = map_00;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_CreateObject_InMem(sundataindex init_size,
                                          SUNContext sunctx,
                                          SUNDataNode* node_out)
{
  SUNFunctionBegin(sunctx);

  SUNDataNode node = sunDataNode_CreateCommon_InMem(sunctx);

  BASE_MEMBER(node, dtype) = SUNDATANODE_OBJECT;

  SUNHashMap map;
  SUNCheckCall(SUNHashMap_New(init_size, sunDataNode_FreeKeyValue_InMem, &map));

  IMPL_MEMBER(node, named_children) = map;

  *node_out = node;
  return SUN_SUCCESS;
}